

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O2

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadAnimations(OgreBinarySerializer *this,Mesh *mesh)

{
  uint16_t uVar1;
  Animation *this_00;
  ulong uVar2;
  float fVar3;
  Animation *anim;
  string local_50;
  
  if (*(int *)&this->m_reader->end != *(int *)&this->m_reader->current) {
    uVar1 = ReadHeader(this,true);
    while( true ) {
      uVar2 = (long)this->m_reader->end - (long)this->m_reader->current;
      if ((uVar1 != 0xd100) || ((uVar2 & 0xffffffff) == 0)) break;
      this_00 = (Animation *)operator_new(0x70);
      Animation::Animation(this_00,mesh);
      anim = this_00;
      ReadLine_abi_cxx11_(&local_50,this);
      std::__cxx11::string::operator=((string *)&anim->name,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      fVar3 = Read<float>(this);
      anim->length = fVar3;
      ReadAnimation(this,anim);
      std::vector<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>::push_back
                (&mesh->animations,&anim);
      if (*(int *)&this->m_reader->end == *(int *)&this->m_reader->current) {
        uVar1 = 0xd100;
      }
      else {
        uVar1 = ReadHeader(this,true);
      }
    }
    if ((int)uVar2 != 0) {
      RollbackHeader(this);
    }
  }
  return;
}

Assistant:

bool OgreBinarySerializer::AtEnd() const
{
    return (m_reader->GetRemainingSize() == 0);
}